

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O3

uchar * CVmRun::get_named_args_from_frame(vm_val_t *fp,vm_val_t **arg0)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  CVmNativeCodeDesc *pCVar2;
  size_t sVar3;
  char *pcVar4;
  char cVar5;
  uint uVar6;
  vm_val_t *pvVar7;
  
  uVar6 = fp[-4].val.obj;
  aVar1 = fp[-3].val;
  pCVar2 = fp[-5].val.native_desc;
  if (pCVar2 != (CVmNativeCodeDesc *)0x0 && uVar6 == 0) {
    pcVar4 = *(char **)&pCVar2[5].opt_argc_;
    if (pcVar4 == (char *)0x0) {
      return (uchar *)0x0;
    }
    cVar5 = *pcVar4;
    sVar3 = CVmOpcodes::get_op_size((uchar *)(pcVar4 + (cVar5 == 'v')));
    uVar6 = ((int)sVar3 + (int)(pcVar4 + (cVar5 == 'v'))) - aVar1.obj;
  }
  if (aVar1.ptr == (void *)0x0) {
    return (uchar *)0x0;
  }
  if (uVar6 == 0) {
    return (uchar *)0x0;
  }
  pcVar4 = (char *)((ulong)uVar6 + (long)aVar1.ptr);
  cVar5 = *(char *)((long)aVar1.ptr + (ulong)uVar6);
  if (cVar5 == 'V') {
    pcVar4 = pcVar4 + (ulong)*(ushort *)(pcVar4 + 2) + 2;
    cVar5 = *pcVar4;
  }
  if (cVar5 != 'W') {
    return (uchar *)0x0;
  }
  if (pCVar2 == (CVmNativeCodeDesc *)0x0) {
    pvVar7 = fp + (-0xc - (long)fp[-2].val.intval);
  }
  else {
    pvVar7 = (vm_val_t *)(*(long *)pCVar2 + (long)pCVar2->varargs_ * -0x10);
  }
  *arg0 = pvVar7;
  *arg0 = pvVar7 + (1 - (ulong)*(ushort *)(pcVar4 + 3));
  return (uchar *)(pcVar4 + 3);
}

Assistant:

const uchar *CVmRun::get_named_args_from_frame(
    VMG_ vm_val_t *fp, vm_val_t **arg0)
{
    /* get the return address */
    pool_ofs_t ofs = G_interpreter->get_return_ofs_from_frame(vmg_ fp);
    const uchar *ep =
        G_interpreter->get_enclosing_entry_ptr_from_frame(vmg_ fp);
    const vm_rcdesc *rc = G_interpreter->get_rcdesc_from_frame(vmg_ fp);

    /* check for a recursive native code caller */
    if (ofs == 0 && rc != 0 && rc->has_return_addr())
    {
        /* get the return address from the descriptor */
        ofs = rc->get_return_addr() - ep;
    }

    /* if there's no return address, there's no table */
    if (ep == 0 || ofs == 0)
        return 0;

    /* get the return instruction pointer */
    const uchar *ip = ep + ofs;
    
    /* if it's a NamedArgPtr instruction, follows the pointer */
    if (*ip == OPC_NAMEDARGPTR)
        ip += 2 + osrp2(ip+2);

    /* make sure we're at a NamedArgTab instruction */
    if (*ip == OPC_NAMEDARGTAB)
    {
        /* 
         *   We have a named argument table.  Fill in *arg0 with a pointer to
         *   the first named argument value in the stack frame.
         *   
         *   If there's a native caller at this level, get the arguments to
         *   the native caller instead of the arguments to the bytecode
         *   callee.  Native callers never send named arguments, so we can
         *   ignore the callee's arguments and look only at the native
         *   caller's arguments.  
         */
        int argc;
        if (rc != 0)
        {
            /* native caller - get the native code's arguments */
            argc = rc->argc;
            *arg0 = rc->argp - argc;
        }
        else
        {
            /* bytecode caller - get the current level's arguments */
            argc = G_interpreter->get_argc_from_frame(vmg_ fp);
            *arg0 = G_interpreter->get_param_from_frame(vmg_ fp, argc);
        }

        /* skip the NamedArgTab opcode and table length prefix */
        ip += 1 + 2;

        /* 
         *   Adjust arg0 for the number of arguments.  The compiler generates
         *   the names in the same order as the pushes, so the first name is
         *   the first value pushed. 
         */
        *arg0 -= (osrp2(ip) - 1);

        /* 
         *   return the table pointer - it starts after the NamedArgTab
         *   instruction and table byte length prefix 
         */
        return ip;
    }
    
    /* there's no named argument table in this return frame */
    return 0;
}